

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcQbf.c
# Opt level: O0

void Abc_NtkVectorPrintPars(Vec_Int_t *vPiValues,int nPars)

{
  uint uVar1;
  int local_18;
  int i;
  int nPars_local;
  Vec_Int_t *vPiValues_local;
  
  for (local_18 = 0; local_18 < nPars; local_18 = local_18 + 1) {
    uVar1 = Vec_IntEntry(vPiValues,local_18);
    printf("%d",(ulong)uVar1);
  }
  return;
}

Assistant:

void Abc_NtkVectorPrintPars( Vec_Int_t * vPiValues, int nPars )
{
    int i;
    for ( i = 0; i < nPars; i++ )
        printf( "%d", Vec_IntEntry(vPiValues,i) );
}